

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t exr_decoding_destroy(exr_const_context_t ctxt,exr_decode_pipeline_t *decode)

{
  long *in_RSI;
  long in_RDI;
  exr_decode_pipeline_t nil;
  _internal_exr_context *pctxt;
  undefined1 local_200 [16];
  size_t *in_stack_fffffffffffffe10;
  void **in_stack_fffffffffffffe18;
  exr_transcoding_pipeline_buffer_id_t in_stack_fffffffffffffe24;
  exr_decode_pipeline_t *in_stack_fffffffffffffe28;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (long *)0x0) {
      memset(local_200,0,0x1e0);
      if ((long *)*in_RSI != in_RSI + 0x1e) {
        (**(code **)(in_RDI + 0x60))(*in_RSI);
      }
      if ((in_RSI[0xe] == in_RSI[0xc]) && (in_RSI[0xf] == 0)) {
        in_RSI[0xe] = 0;
      }
      internal_decode_free_buffer
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
      memcpy(in_RSI,local_200,0x1e0);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_decoding_destroy (exr_const_context_t ctxt, exr_decode_pipeline_t* decode)
{
    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);
    if (decode)
    {
        exr_decode_pipeline_t nil = {0};
        if (decode->channels != decode->_quick_chan_store)
            pctxt->free_fn (decode->channels);

        if (decode->unpacked_buffer == decode->packed_buffer &&
            decode->unpacked_alloc_size == 0)
            decode->unpacked_buffer = NULL;

        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED,
            (void**) &(decode->packed_buffer),
            &(decode->packed_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            (void**) &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(decode->scratch_buffer_1),
            &(decode->scratch_alloc_size_1));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SCRATCH2,
            &(decode->scratch_buffer_2),
            &(decode->scratch_alloc_size_2));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(decode->packed_sample_count_table),
            &(decode->packed_sample_count_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SAMPLES,
            (void**) &(decode->sample_count_table),
            &(decode->sample_count_alloc_size));
        *decode = nil;
    }
    return EXR_ERR_SUCCESS;
}